

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O2

int Col_StringBufferAppendSequence(Col_Word strbuf,ColRopeIterator *begin,ColRopeIterator *end)

{
  int iVar1;
  Col_Char c;
  uint uVar2;
  Col_Word rope;
  uint uVar3;
  Col_RopeIterator it;
  
  iVar1 = Col_RopeIterCompare(begin,end);
  if (-1 < iVar1) {
    return 1;
  }
  if (strbuf == 0) {
    strbuf = 0;
  }
  else {
    if ((strbuf & 0xf) == 0) {
      if ((*(byte *)strbuf & 2) == 0) goto LAB_0010c30e;
      uVar3 = *(byte *)strbuf & 0xfffffffe;
    }
    else {
      uVar3 = immediateWordTypes[(uint)strbuf & 0x1f];
    }
    if ((uVar3 == 2) && ((*(byte *)(strbuf + 2) & 0xc) == 0)) {
      strbuf = *(Col_Word *)(strbuf + 0x10);
    }
  }
LAB_0010c30e:
  if (begin->rope != 0) {
    if (((ulong)*(ushort *)(strbuf + 2) * 0x20 - 0x18) / (ulong)(*(byte *)(strbuf + 1) & 7) -
        *(long *)(strbuf + 0x10) < end->index - begin->index) {
      rope = Col_Subrope(begin->rope,begin->index,end->index - 1);
      iVar1 = Col_StringBufferAppendRope(strbuf,rope);
      return iVar1;
    }
  }
  it[0].rope = begin->rope;
  it[0].length = begin->length;
  it[0].index = begin->index;
  it[0].chunk.first = (begin->chunk).first;
  it[0].chunk.last = (begin->chunk).last;
  it[0].chunk.accessProc = (begin->chunk).accessProc;
  it[0].chunk.current._0_8_ = (begin->chunk).current.access.leaf;
  it[0].chunk.current._8_8_ = (begin->chunk).current.access.index;
  uVar3 = 1;
  while (iVar1 = Col_RopeIterCompare(it,end), iVar1 < 0) {
    if ((it[0].index < it[0].chunk.first) || (it[0].chunk.last < it[0].index)) {
      c = ColRopeIterUpdateTraversalInfo(it);
    }
    else if (it[0].chunk.accessProc == (undefined1 *)0x0) {
      if (it[0].chunk.current.direct.format == COL_UTF16) {
        c = Col_Utf16Get((Col_Char2 *)it[0].chunk.current._8_8_);
      }
      else if (it[0].chunk.current.direct.format == COL_UCS2) {
        c = (Col_Char)*(ushort *)it[0].chunk.current._8_8_;
      }
      else if (it[0].chunk.current.direct.format == COL_UCS4) {
        c = *(Col_Char *)it[0].chunk.current._8_8_;
      }
      else if (it[0].chunk.current.direct.format == COL_UTF8) {
        c = Col_Utf8Get((Col_Char1 *)it[0].chunk.current._8_8_);
      }
      else {
        c = 0xffffffff;
        if (it[0].chunk.current.direct.format == COL_UCS1) {
          c = (Col_Char)*(byte *)it[0].chunk.current._8_8_;
        }
      }
    }
    else {
      c = (*(code *)it[0].chunk.accessProc)
                    (it[0].chunk.current.access.leaf,it[0].chunk.current.access.index);
    }
    uVar2 = Col_StringBufferAppendChar(strbuf,c);
    uVar3 = uVar2 & uVar3;
    if ((it[0].index < it[0].chunk.first) || (it[0].chunk.last <= it[0].index)) {
      Col_RopeIterForward(it,1);
    }
    else {
      it[0].index = it[0].index + 1;
      if (it[0].chunk.accessProc == (undefined1 *)0x0) {
        if (it[0].chunk.current.direct.format == COL_UTF16) {
          it[0].chunk.current._8_8_ = Col_Utf16Next((Col_Char2 *)it[0].chunk.current._8_8_);
        }
        else if (it[0].chunk.current.direct.format == COL_UCS2) {
          it[0].chunk.current._8_8_ = it[0].chunk.current.access.index + 2;
        }
        else if (it[0].chunk.current.direct.format == COL_UCS4) {
          it[0].chunk.current._8_8_ = it[0].chunk.current.access.index + 4;
        }
        else if (it[0].chunk.current.direct.format == COL_UTF8) {
          it[0].chunk.current._8_8_ = Col_Utf8Next((Col_Char1 *)it[0].chunk.current._8_8_);
        }
        else if (it[0].chunk.current.direct.format == COL_UCS1) {
          it[0].chunk.current._8_8_ = it[0].chunk.current.access.index + 1;
        }
        else {
          it[0].chunk.current._8_8_ = 0;
        }
      }
      else {
        it[0].chunk.current._8_8_ = it[0].chunk.current.access.index + 1;
      }
    }
  }
  return uVar3;
}

Assistant:

int
Col_StringBufferAppendSequence(
    Col_Word strbuf,                /*!< String buffer to append character
                                         sequence to. */
    const Col_RopeIterator begin,   /*!< First character in sequence. */
    const Col_RopeIterator end)     /*!< First character past sequence end. */
{
    Col_StringFormat format;
    Col_Word rope;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return 0;

    if (Col_RopeIterCompare(begin, end) >= 0) {
        /*
         * Nothing to do.
         */

        return 1;
    }

    WORD_UNWRAP(strbuf);

    rope = Col_RopeIterRope(begin);
    format = (Col_StringFormat) WORD_STRBUF_FORMAT(strbuf);
    if (!rope || (Col_RopeIterIndex(end) - Col_RopeIterIndex(begin))
            <= STRBUF_MAX_LENGTH(WORD_STRBUF_SIZE(strbuf)
            * CELL_SIZE, format) - WORD_STRBUF_LENGTH(strbuf)) {
        /*
         * Sequence is in string mode or fits into buffer, append
         * character-wise.
         */

        Col_RopeIterator it;
        int noLoss = 1;
        for (Col_RopeIterSet(it, begin); Col_RopeIterCompare(it, end) < 0;
                Col_RopeIterNext(it)) {
            noLoss &= Col_StringBufferAppendChar(strbuf, Col_RopeIterAt(it));
        }
        return noLoss;
    }

    /*
     * Append subrope.
     */

    return Col_StringBufferAppendRope(strbuf, Col_Subrope(rope,
            Col_RopeIterIndex(begin), Col_RopeIterIndex(end)-1));
}